

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

float64 helper_fdiv(CPUPPCState_conflict *env,float64 arg1,float64 arg2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float64 fVar4;
  uintptr_t unaff_retaddr;
  int status;
  float64 ret;
  float64 arg2_local;
  float64 arg1_local;
  CPUPPCState_conflict *env_local;
  
  fVar4 = float64_div_ppc(arg1,arg2,&env->fp_status);
  uVar1 = get_float_exception_flags(&env->fp_status);
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = float64_classify(arg1);
      uVar3 = float64_classify(arg2);
      float_invalid_op_div(env,true,unaff_retaddr,uVar2 | uVar3);
    }
    if ((uVar1 & 4) != 0) {
      float_zero_divide_excp(env,unaff_retaddr);
    }
  }
  return fVar4;
}

Assistant:

static inline floatx80 helper_fdiv(CPUX86State *env, floatx80 a, floatx80 b)
{
    if (floatx80_is_zero(b)) {
        fpu_set_exception(env, FPUS_ZE);
    }
    return floatx80_div(a, b, &env->fp_status);
}